

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

ConstraintBlockSymbol *
slang::ast::ConstraintBlockSymbol::fromSyntax(Scope *scope,ConstraintPrototypeSyntax *syntax)

{
  undefined2 uVar1;
  ConstraintBlockSymbol *this;
  Info *args;
  SyntaxNode *this_00;
  iterator pTVar2;
  Symbol *pSVar3;
  ClassType *type;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceRange sourceRange;
  ClassType *classType;
  Token qual;
  iterator __end2;
  iterator __begin2;
  TokenList *__range2;
  SourceLocation local_50;
  string_view local_48;
  ConstraintBlockSymbol *local_38;
  ConstraintBlockSymbol *result;
  Token nameToken;
  Compilation *comp;
  ConstraintPrototypeSyntax *syntax_local;
  Scope *scope_local;
  
  nameToken.info = (Info *)Scope::getCompilation(scope);
  this_00 = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::operator->(&syntax->name);
  _result = slang::syntax::SyntaxNode::getLastToken(this_00);
  args = nameToken.info;
  local_48 = parsing::Token::valueText((Token *)&result);
  local_50 = parsing::Token::location((Token *)&result);
  local_38 = BumpAllocator::
             emplace<slang::ast::ConstraintBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       ((BumpAllocator *)args,(Compilation *)args,&local_48,&local_50);
  Symbol::setSyntax(&local_38->super_Symbol,(SyntaxNode *)syntax);
  this = local_38;
  syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
  local_38->isExtern = true;
  __end2 = nonstd::span_lite::span<slang::parsing::Token,_18446744073709551615UL>::begin
                     (&(syntax->qualifiers).
                       super_span<slang::parsing::Token,_18446744073709551615UL>);
  pTVar2 = nonstd::span_lite::span<slang::parsing::Token,_18446744073709551615UL>::end
                     (&(syntax->qualifiers).
                       super_span<slang::parsing::Token,_18446744073709551615UL>);
  for (; __end2 != pTVar2; __end2 = __end2 + 1) {
    uVar1 = __end2->kind;
    if (uVar1 == 0xa8) {
      local_38->isExplicitExtern = true;
    }
    else if (uVar1 == 0xf9) {
      local_38->isPure = true;
    }
    else if (uVar1 == 0x11d) {
      local_38->isStatic = true;
    }
  }
  pSVar3 = Scope::asSymbol(scope);
  if (pSVar3->kind == ClassType) {
    pSVar3 = Scope::asSymbol(scope);
    type = Symbol::as<slang::ast::ClassType>(pSVar3);
    if (((local_38->isPure & 1U) != 0) && ((type->isAbstract & 1U) == 0)) {
      sourceRange = parsing::Token::range((Token *)&result);
      Scope::addDiag(scope,(DiagCode)0x870006,sourceRange);
    }
    if ((local_38->isStatic & 1U) == 0) {
      addThisVar(local_38,&type->super_Type);
    }
  }
  return local_38;
}

Assistant:

ConstraintBlockSymbol& ConstraintBlockSymbol::fromSyntax(const Scope& scope,
                                                         const ConstraintPrototypeSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto nameToken = syntax.name->getLastToken();
    auto result = comp.emplace<ConstraintBlockSymbol>(comp, nameToken.valueText(),
                                                      nameToken.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->isExtern = true;

    for (auto qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::StaticKeyword:
                result->isStatic = true;
                break;
            case TokenKind::ExternKeyword:
                result->isExplicitExtern = true;
                break;
            case TokenKind::PureKeyword:
                result->isPure = true;
                break;
            default:
                break;
        }
    }

    if (scope.asSymbol().kind == SymbolKind::ClassType) {
        auto& classType = scope.asSymbol().as<ClassType>();
        if (result->isPure && !classType.isAbstract)
            scope.addDiag(diag::PureConstraintInAbstract, nameToken.range());

        if (!result->isStatic)
            result->addThisVar(classType);
    }

    return *result;
}